

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  int iVar1;
  FieldGenerator *pFVar2;
  long *plVar3;
  Descriptor *pDVar4;
  int iVar5;
  int i;
  int extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_01;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  string local_58;
  FieldGeneratorMap *local_38;
  
  value = &this->classname_;
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    io::Printer::Print(printer,
                       "void $classname$::CheckTypeAndMergeFrom(\n    const ::google::protobuf::MessageLite& from) {\n  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n}\n\n"
                       ,"classname",value);
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n  GOOGLE_CHECK_NE(&from, this);\n"
                       ,"classname",value);
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "const $classname$* source =\n  ::google::protobuf::internal::dynamic_cast_if_available<const $classname$*>(\n    &from);\nif (source == NULL) {\n  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n} else {\n  MergeFrom(*source);\n}\n"
                       ,"classname",value);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  io::Printer::Print(printer,
                     "void $classname$::MergeFrom(const $classname$& from) {\n  GOOGLE_CHECK_NE(&from, this);\n"
                     ,"classname",value);
  io::Printer::Indent(printer);
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    lVar7 = 0;
    lVar8 = 0;
    lVar6 = extraout_RDX;
    do {
      if (*(int *)(*(long *)(pDVar4 + 0x30) + 0x30 + lVar7) == 3) {
        pFVar2 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + lVar7));
        (*pFVar2->_vptr_FieldGenerator[7])(pFVar2,printer);
        pDVar4 = this->descriptor_;
        lVar6 = extraout_RDX_00;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar8 < *(int *)(pDVar4 + 0x2c));
    if (0 < *(int *)(pDVar4 + 0x2c)) {
      iVar5 = -1;
      lVar7 = 0;
      uVar9 = 0;
      local_38 = &this->field_generators_;
      do {
        i = (int)lVar6;
        lVar6 = *(long *)(pDVar4 + 0x30);
        if (*(int *)(lVar6 + 0x30 + lVar7) != 3) {
          iVar1 = iVar5 + 7;
          if (iVar5 >= 0) {
            iVar1 = iVar5;
          }
          if (iVar5 < 0) {
LAB_0019643d:
            if (-1 < iVar5) {
              io::Printer::Outdent(printer);
              io::Printer::Print(printer,"}\n");
              i = extraout_EDX;
            }
            if (*(char *)(lVar6 + 0x34 + lVar7) == '\0') {
              plVar3 = (long *)(*(long *)(lVar6 + 0x38 + lVar7) + 0x30);
            }
            else {
              lVar8 = *(long *)(lVar6 + 0x40 + lVar7);
              if (lVar8 == 0) {
                plVar3 = (long *)(*(long *)(lVar6 + 0x20 + lVar7) + 0x80);
              }
              else {
                plVar3 = (long *)(lVar8 + 0x70);
              }
            }
            SimpleItoa_abi_cxx11_
                      (&local_58,
                       (protobuf *)
                       (ulong)(uint)((int)((ulong)((lVar6 - *plVar3) + lVar7) >> 3) * -0x11111111),i
                      );
            io::Printer::Print(printer,
                               "if (from._has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
                               "index",&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            io::Printer::Indent(printer);
            field = extraout_RDX_01;
          }
          else {
            field = (FieldDescriptor *)(uVar9 >> 3 & 0x1fffffff);
            i = (int)field;
            if (i != iVar1 >> 3) goto LAB_0019643d;
          }
          FieldName_abi_cxx11_(&local_58,(cpp *)(lVar6 + lVar7),field);
          io::Printer::Print(printer,"if (from.has_$name$()) {\n","name",&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar2 = FieldGeneratorMap::get(local_38,(FieldDescriptor *)(lVar6 + lVar7));
          (*pFVar2->_vptr_FieldGenerator[7])(pFVar2,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          pDVar4 = this->descriptor_;
          iVar5 = (int)uVar9;
        }
        uVar9 = uVar9 + 1;
        lVar6 = (long)*(int *)(pDVar4 + 0x2c);
        lVar7 = lVar7 + 0x78;
      } while ((long)uVar9 < lVar6);
      if (-1 < iVar5) {
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
        pDVar4 = this->descriptor_;
      }
    }
  }
  if (0 < *(int *)(pDVar4 + 0x58)) {
    io::Printer::Print(printer,"_extensions_.MergeFrom(from._extensions_);\n");
    pDVar4 = this->descriptor_;
  }
  if (*(int *)(*(long *)(*(long *)(pDVar4 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"mutable_unknown_fields()->MergeFrom(from.unknown_fields());\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file())) {
    // Generate the generalized MergeFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
      "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n"
      "  GOOGLE_CHECK_NE(&from, this);\n",
      "classname", classname_);
    printer->Indent();

    // Cast the message to the proper type. If we find that the message is
    // *not* of the proper type, we can still call Merge via the reflection
    // system, as the GOOGLE_CHECK above ensured that we have the same descriptor
    // for each message.
    printer->Print(
      "const $classname$* source =\n"
      "  ::google::protobuf::internal::dynamic_cast_if_available<const $classname$*>(\n"
      "    &from);\n"
      "if (source == NULL) {\n"
      "  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n"
      "} else {\n"
      "  MergeFrom(*source);\n"
      "}\n",
      "classname", classname_);

    printer->Outdent();
    printer->Print("}\n\n");
  } else {
    // Generate CheckTypeAndMergeFrom().
    printer->Print(
      "void $classname$::CheckTypeAndMergeFrom(\n"
      "    const ::google::protobuf::MessageLite& from) {\n"
      "  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  printer->Print(
    "void $classname$::MergeFrom(const $classname$& from) {\n"
    "  GOOGLE_CHECK_NE(&from, this);\n",
    "classname", classname_);
  printer->Indent();

  // Merge Repeated fields. These fields do not require a
  // check as we can simply iterate over them.
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      field_generators_.get(field).GenerateMergingCode(printer);
    }
  }

  // Merge Optional and Required fields (after a _has_bit check).
  int last_index = -1;

  for (int i = 0; i < descriptor_->field_count(); ++i) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // See above in GenerateClear for an explanation of this.
      if (i / 8 != last_index / 8 || last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (from._has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }

      last_index = i;

      printer->Print(
        "if (from.has_$name$()) {\n",
        "name", FieldName(field));
      printer->Indent();

      field_generators_.get(field).GenerateMergingCode(printer);

      printer->Outdent();
      printer->Print("}\n");
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "mutable_unknown_fields()->MergeFrom(from.unknown_fields());\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}